

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.cpp
# Opt level: O3

bool EncodeSize(size_t size,uchar *out,size_t cbOut,size_t *cbUsed)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  uchar uVar4;
  ulong uVar5;
  uchar local_10 [8];
  uchar tmp [8];
  
  local_10[0] = '\0';
  local_10[1] = '\0';
  local_10[2] = '\0';
  local_10[3] = '\0';
  local_10[4] = '\0';
  local_10[5] = '\0';
  local_10[6] = '\0';
  local_10[7] = '\0';
  if (size < 0x80 && cbOut != 0) {
    *out = (uchar)size;
    *cbUsed = 1;
  }
  else {
    uVar4 = 0x80;
    lVar2 = -1;
    do {
      lVar3 = lVar2;
      if (lVar3 == -8) goto LAB_00137012;
      tmp[lVar3] = (uchar)size;
      uVar5 = size >> 8;
      uVar4 = uVar4 + '\x01';
      bVar1 = 0xff < size;
      lVar2 = lVar3 + -1;
      size = uVar5;
    } while (bVar1);
    tmp[lVar3 + -1] = uVar4;
    *cbUsed = -(lVar3 + -1);
LAB_00137012:
    if ((size != 0) || (uVar5 = *cbUsed, cbOut < uVar5)) {
      return false;
    }
    memcpy_s(out,cbOut,tmp + -uVar5,uVar5);
  }
  return true;
}

Assistant:

bool EncodeSize(size_t size, unsigned char * out, size_t cbOut, size_t & cbUsed)
{
	unsigned char tmp[sizeof(unsigned long long)] = { 0 };
	unsigned int i = 0;

	if (size <= 0x7f && cbOut >= 1)
	{
		*out = static_cast<unsigned char>(size);
		cbUsed = 1;
		return true;
	}

	// Else the first byte is the number of following big-endian
	// non-zero bytes
	for (; i < sizeof(unsigned long long) - 1; ++i)
	{
		// Convert incoming size to big-endian order
		size_t offset = sizeof(unsigned long long) - (i + 1);
		tmp[offset] = static_cast<unsigned char>(size);
		size >>= 8;

		if (size == 0)
		{
			cbUsed = i + 1;
			tmp[offset - 1] = static_cast<unsigned char>(0x80 | (cbUsed));
			cbUsed++;
			break;
		}
	}

	// Detect abnormal loop exit
	if (size != 0)
		return false;

	if (cbOut >= cbUsed)
	{
		memcpy_s(out, cbOut, tmp + sizeof(long long) - cbUsed, cbUsed);
		return true;
	}
	
	return false;
}